

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

void Cec_GiaPrintCofStats2(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  bool bVar3;
  uint local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pCof1;
  Gia_Man_t *pCof0;
  Gia_Man_t *p_local;
  
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar3 = false;
    if ((int)local_2c < iVar1) {
      pGStack_28 = Gia_ManCi(p,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    p_00 = Gia_ManDupCofactorVar(p,local_2c,0);
    p_01 = Gia_ManDupCofactorVar(p,local_2c,1);
    printf("PI %5d :   ",(ulong)local_2c);
    uVar2 = Gia_ObjRefNum(p,pGStack_28);
    printf("Refs = %5d   ",(ulong)uVar2);
    uVar2 = Gia_ManAndNum(p_00);
    printf("Cof0 = %7d   ",(ulong)uVar2);
    uVar2 = Gia_ManAndNum(p_01);
    printf("Cof1 = %7d   ",(ulong)uVar2);
    printf("\n");
    Gia_ManStop(p_00);
    Gia_ManStop(p_01);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Cec_GiaPrintCofStats2( Gia_Man_t * p )
{
    Gia_Man_t * pCof0, * pCof1;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        pCof0 = Gia_ManDupCofactorVar( p, i, 0 );
        pCof1 = Gia_ManDupCofactorVar( p, i, 1 );
        printf( "PI %5d :   ",   i );
        printf( "Refs = %5d   ", Gia_ObjRefNum(p, pObj) );
        printf( "Cof0 = %7d   ", Gia_ManAndNum(pCof0) );
        printf( "Cof1 = %7d   ", Gia_ManAndNum(pCof1) );
        printf( "\n" );
        Gia_ManStop( pCof0 );
        Gia_ManStop( pCof1 );
    }
}